

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

uint SoapySDRDevice_readGPIO(SoapySDRDevice *device,char *bank)

{
  uint uVar1;
  undefined1 *puVar2;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_48,bank,&local_49);
  uVar1 = (**(code **)(*(long *)device + 0x378))(device,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return uVar1;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned SoapySDRDevice_readGPIO(const SoapySDRDevice *device, const char *bank)
{
    __SOAPY_SDR_C_TRY
    return device->readGPIO(bank);
    __SOAPY_SDR_C_CATCH
}